

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_util::split_param
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *p,string *sep,char open_par,char close_par)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  string t;
  string local_70;
  string symbols;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&symbols,sep,open_par);
  uVar5 = 0;
  uVar4 = uVar5;
LAB_00160fa9:
  do {
    if (p->_M_string_length < uVar5) {
      if (uVar5 != uVar4) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)p);
        remove_spaces(&t,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        bVar1 = std::operator!=(&t,"");
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&t);
        }
        std::__cxx11::string::~string((string *)&t);
      }
      std::__cxx11::string::~string((string *)&symbols);
      return __return_storage_ptr__;
    }
    lVar2 = std::__cxx11::string::find_first_of((string *)p,(ulong)&symbols);
    uVar5 = 0xffffffffffffffff;
  } while (lVar2 == -1);
  if ((p->_M_dataplus)._M_p[lVar2] == open_par) goto code_r0x00160fdf;
  goto LAB_0016100b;
code_r0x00160fdf:
  sVar3 = std::__cxx11::string::find((char)p,(ulong)(uint)(int)close_par);
  lVar2 = sVar3 + 1;
  if (lVar2 != -1 && sVar3 != p->_M_string_length) {
LAB_0016100b:
    std::__cxx11::string::substr((ulong)&local_70,(ulong)p);
    remove_spaces(&t,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&t);
    uVar5 = lVar2 + 1;
    std::__cxx11::string::~string((string *)&t);
    uVar4 = uVar5;
  }
  goto LAB_00160fa9;
}

Assistant:

vector<string> split_param(const string &p, const string &sep,
                               char open_par, char close_par)
    {
        vector<string> temp;
        string::size_type pos = 0;
        string::size_type old_pos = 0;

        string symbols = sep + open_par;

        while (pos <= p.size()) {
            pos = p.find_first_of(symbols, pos);

            if (pos != string::npos)
                if (p[pos] == open_par) {
                    pos = p.find(close_par, pos);
                    if (pos == p.size()) pos = string::npos;
                    else ++pos;
                }

            if (pos != string::npos) {
                string t = remove_spaces(p.substr(old_pos, pos - old_pos));

                temp.push_back(t);

                old_pos = ++pos;
            }
        }

        if (pos != old_pos) {
            string t = remove_spaces(p.substr(old_pos, p.size() - old_pos));

            if (t != "") temp.push_back(t);
        }

        return temp;
    }